

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_color.cxx
# Opt level: O3

void Fl::free_color(Fl_Color i,int overlay)

{
  uchar uVar1;
  ulong uVar2;
  
  if (overlay != 0) {
    return;
  }
  uVar2 = (ulong)i;
  uVar1 = fl_xmap[0][uVar2].mapped;
  if (uVar1 != '\0') {
    if (uVar1 == '\x01') {
      XFreeColors(fl_display,fl_colormap,uVar2 * 0x10 + 0x2a1d98,1,0);
    }
    fl_xmap[0][uVar2].mapped = '\0';
  }
  return;
}

Assistant:

void Fl::free_color(Fl_Color i, int overlay) {
#  if HAVE_OVERLAY
#  else
  if (overlay) return;
#  endif
  if (fl_xmap[overlay][i].mapped) {
#  if USE_COLORMAP
#    if HAVE_OVERLAY
    Colormap colormap = overlay ? fl_overlay_colormap : fl_colormap;
#    else
    Colormap colormap = fl_colormap;
#    endif
    if (fl_xmap[overlay][i].mapped == 1)
      XFreeColors(fl_display, colormap, &(fl_xmap[overlay][i].pixel), 1, 0);
#  endif
    fl_xmap[overlay][i].mapped = 0;
  }
}